

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

void TTD::NSSnapObjects::AssertSnapEquiv
               (SnapObject *sobj1,SnapObject *sobj2,TTDCompareMap *compareMap)

{
  SnapHandler *pSVar1;
  TTDVar v1;
  TTDVar v2;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  bool local_ea;
  bool local_e9;
  bool local_d9;
  bool local_c9;
  fPtr_AssertSnapEquivAddtlInfo equivCheck;
  TTDVar var2;
  TTDVar var1;
  int64 iStack_a8;
  int32 idx1;
  int64 locationTag_1;
  SnapEntryDataKindTag SStack_98;
  SnapHandlerPropertyEntry spe_1;
  uint32 i_1;
  SnapHandler *handler2;
  int64 local_78;
  int64 locationTag;
  SnapEntryDataKindTag SStack_68;
  SnapHandlerPropertyEntry spe;
  uint32 i;
  BaseDictionary<long,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  sobj1PidMap;
  SnapHandler *handler1;
  TTDCompareMap *compareMap_local;
  SnapObject *sobj2_local;
  SnapObject *sobj1_local;
  
  TTDCompareMap::DiagnosticAssert(compareMap,sobj1->SnapObjectTag == sobj2->SnapObjectTag);
  local_c9 = true;
  if (sobj1->OptWellKnownToken != sobj2->OptWellKnownToken) {
    local_d9 = false;
    if ((sobj1->OptWellKnownToken != (TTD_WELLKNOWN_TOKEN)0x0) &&
       (local_d9 = false, sobj2->OptWellKnownToken != (TTD_WELLKNOWN_TOKEN)0x0)) {
      iVar4 = PAL_wcscmp(sobj1->OptWellKnownToken,sobj2->OptWellKnownToken);
      local_d9 = iVar4 == 0;
    }
    local_c9 = local_d9;
  }
  TTDCompareMap::DiagnosticAssert(compareMap,local_c9);
  NSSnapType::AssertSnapEquiv(sobj1->SnapType,sobj2->SnapType,compareMap);
  if ((sobj1->OptDependsOnInfo != (DependsOnInfo *)0x0) ||
     (local_e9 = true, sobj2->OptDependsOnInfo != (DependsOnInfo *)0x0)) {
    local_e9 = sobj1->OptDependsOnInfo->DepOnCount == sobj2->OptDependsOnInfo->DepOnCount;
  }
  TTDCompareMap::DiagnosticAssert(compareMap,local_e9);
  if ((compareMap->StrictCrossSite & 1U) == 0) {
    local_ea = true;
    if (sobj1->IsCrossSite != 0) {
      local_ea = sobj2->IsCrossSite != 0;
    }
    TTDCompareMap::DiagnosticAssert(compareMap,local_ea);
  }
  else {
    TTDCompareMap::DiagnosticAssert(compareMap,sobj1->IsCrossSite == sobj2->IsCrossSite);
  }
  bVar2 = Js::DynamicType::Is(sobj1->SnapType->JsTypeId);
  bVar3 = Js::DynamicType::Is(sobj2->SnapType->JsTypeId);
  TTDCompareMap::DiagnosticAssert(compareMap,bVar2 == bVar3);
  bVar2 = Js::DynamicType::Is(sobj1->SnapType->JsTypeId);
  if (bVar2) {
    TTDCompareMap::CheckConsistentAndAddPtrIdMapping_Special
              (compareMap,sobj1->OptIndexedObjectArray,sobj2->OptIndexedObjectArray,
               L"indexedObjectArray");
    pSVar1 = sobj1->SnapType->TypeHandlerInfo;
    JsUtil::
    BaseDictionary<long,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary((BaseDictionary<long,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      *)&spe.DataKind,&Memory::HeapAllocator::Instance,0);
    for (spe.PropertyRecordId = 0; (uint)spe.PropertyRecordId < pSVar1->MaxPropertyIndex;
        spe.PropertyRecordId = spe.PropertyRecordId + 1) {
      unique0x00012000 = pSVar1->PropertyInfoArray[(uint)spe.PropertyRecordId];
      if (SStack_68 != Clear) {
        local_78 = NSSnapType::ComputeLocationTagForAssertCompare
                             ((SnapHandlerPropertyEntry *)((long)&locationTag + 4));
        handler2._0_4_ = spe.PropertyRecordId;
        JsUtil::
        BaseDictionary<long,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::AddNew((BaseDictionary<long,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)&spe.DataKind,&local_78,(int *)&handler2);
      }
    }
    unique0x00012000 = sobj2->SnapType->TypeHandlerInfo;
    for (spe_1.PropertyRecordId = 0;
        (uint)spe_1.PropertyRecordId < stack0xffffffffffffff70->MaxPropertyIndex;
        spe_1.PropertyRecordId = spe_1.PropertyRecordId + 1) {
      unique0x00012000 = stack0xffffffffffffff70->PropertyInfoArray[(uint)spe_1.PropertyRecordId];
      if ((SStack_98 != Clear) && (SStack_98 != Uninitialized)) {
        iStack_a8 = NSSnapType::ComputeLocationTagForAssertCompare
                              ((SnapHandlerPropertyEntry *)((long)&locationTag_1 + 4));
        var1._0_4_ = 0xffffffff;
        piVar5 = JsUtil::
                 BaseDictionary<long,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::LookupWithKey<long>
                           ((BaseDictionary<long,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                             *)&spe.DataKind,&stack0xffffffffffffff58,(int *)&var1);
        var1._4_4_ = *piVar5;
        TTDCompareMap::DiagnosticAssert(compareMap,var1._4_4_ != -1);
        v1 = sobj1->VarArray[var1._4_4_];
        v2 = sobj2->VarArray[(uint)spe_1.PropertyRecordId];
        if (SStack_98 == Data) {
          NSSnapValues::AssertSnapEquivTTDVar_Property(v1,v2,compareMap,locationTag_1._4_4_);
        }
        else if (SStack_98 == Getter) {
          NSSnapValues::AssertSnapEquivTTDVar_PropertyGetter(v1,v2,compareMap,locationTag_1._4_4_);
        }
        else {
          if (SStack_98 != Setter) {
            TTDAbort_unrecoverable_error("What other tags are there???");
          }
          NSSnapValues::AssertSnapEquivTTDVar_PropertySetter(v1,v2,compareMap,locationTag_1._4_4_);
        }
      }
    }
    JsUtil::
    BaseDictionary<long,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::~BaseDictionary((BaseDictionary<long,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       *)&spe.DataKind);
  }
  if (compareMap->SnapObjCmpVTable[(int)sobj1->SnapObjectTag] != (fPtr_AssertSnapEquivAddtlInfo)0x0)
  {
    (*compareMap->SnapObjCmpVTable[(int)sobj1->SnapObjectTag])(sobj1,sobj2,compareMap);
  }
  return;
}

Assistant:

void AssertSnapEquiv(const SnapObject* sobj1, const SnapObject* sobj2, TTDCompareMap& compareMap)
        {
            compareMap.DiagnosticAssert(sobj1->SnapObjectTag == sobj2->SnapObjectTag);
            compareMap.DiagnosticAssert(TTD_DIAGNOSTIC_COMPARE_WELLKNOWN_TOKENS(sobj1->OptWellKnownToken, sobj2->OptWellKnownToken));

            NSSnapType::AssertSnapEquiv(sobj1->SnapType, sobj2->SnapType, compareMap);

            //Depends on info is a function of the rest of the properties so we don't need to explicitly check it.
            //But for sanity assert same counts.
            compareMap.DiagnosticAssert((sobj1->OptDependsOnInfo == nullptr && sobj2->OptDependsOnInfo == nullptr) || (sobj1->OptDependsOnInfo->DepOnCount == sobj2->OptDependsOnInfo->DepOnCount));

            //we allow the replay in debug mode to be cross site even if orig was not (that is ok) but if record was x-site then replay must be as well
            if(compareMap.StrictCrossSite)
            {
                compareMap.DiagnosticAssert(sobj1->IsCrossSite == sobj2->IsCrossSite);
            }
            else
            {
                compareMap.DiagnosticAssert(!sobj1->IsCrossSite || sobj2->IsCrossSite);
            }

#if ENABLE_OBJECT_SOURCE_TRACKING
            compareMap.DiagnosticAssert(sobj1->DiagOriginInfo.SourceLine == sobj2->DiagOriginInfo.SourceLine);
            compareMap.DiagnosticAssert(sobj1->DiagOriginInfo.EventTime == sobj2->DiagOriginInfo.EventTime);
            compareMap.DiagnosticAssert(sobj1->DiagOriginInfo.TimeHash == sobj2->DiagOriginInfo.TimeHash);
#endif

            compareMap.DiagnosticAssert(Js::DynamicType::Is(sobj1->SnapType->JsTypeId) == Js::DynamicType::Is(sobj2->SnapType->JsTypeId));
            if(Js::DynamicType::Is(sobj1->SnapType->JsTypeId))
            {
                compareMap.CheckConsistentAndAddPtrIdMapping_Special(sobj1->OptIndexedObjectArray, sobj2->OptIndexedObjectArray, _u("indexedObjectArray"));

                const NSSnapType::SnapHandler* handler1 = sobj1->SnapType->TypeHandlerInfo;
                JsUtil::BaseDictionary<int64, int32, HeapAllocator> sobj1PidMap(&HeapAllocator::Instance);
                for(uint32 i = 0; i < handler1->MaxPropertyIndex; ++i)
                {
                    const NSSnapType::SnapHandlerPropertyEntry spe = handler1->PropertyInfoArray[i];
                    if(spe.DataKind != NSSnapType::SnapEntryDataKindTag::Clear)
                    {
                        int64 locationTag = ComputeLocationTagForAssertCompare(spe);
                        sobj1PidMap.AddNew(locationTag, (int32)i);
                    }
                }

                const NSSnapType::SnapHandler* handler2 = sobj2->SnapType->TypeHandlerInfo;
                for(uint32 i = 0; i < handler2->MaxPropertyIndex; ++i)
                {
                    const NSSnapType::SnapHandlerPropertyEntry spe = handler2->PropertyInfoArray[i];
                    if(spe.DataKind != NSSnapType::SnapEntryDataKindTag::Clear && spe.DataKind != NSSnapType::SnapEntryDataKindTag::Uninitialized)
                    {
                        int64 locationTag = ComputeLocationTagForAssertCompare(spe);

                        int32 idx1 = sobj1PidMap.LookupWithKey(locationTag, -1);
                        compareMap.DiagnosticAssert(idx1 != -1);

                        TTDVar var1 = sobj1->VarArray[idx1];
                        TTDVar var2 = sobj2->VarArray[i];

                        if(spe.DataKind == NSSnapType::SnapEntryDataKindTag::Data)
                        {
                            NSSnapValues::AssertSnapEquivTTDVar_Property(var1, var2, compareMap, spe.PropertyRecordId);
                        }
                        else if(spe.DataKind == NSSnapType::SnapEntryDataKindTag::Getter)
                        {
                            NSSnapValues::AssertSnapEquivTTDVar_PropertyGetter(var1, var2, compareMap, spe.PropertyRecordId);
                        }
                        else
                        {
                            TTDAssert(spe.DataKind == NSSnapType::SnapEntryDataKindTag::Setter, "What other tags are there???");

                            NSSnapValues::AssertSnapEquivTTDVar_PropertySetter(var1, var2, compareMap, spe.PropertyRecordId);
                        }
                    }
                }
            }

            fPtr_AssertSnapEquivAddtlInfo equivCheck = compareMap.SnapObjCmpVTable[(int32)sobj1->SnapObjectTag];
            if(equivCheck != nullptr)
            {
                equivCheck(sobj1, sobj2, compareMap);
            }
        }